

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O1

void __thiscall
uWS::Group<true>::Group(Group<true> *this,int extensionOptions,Hub *hub,NodeData *nodeData)

{
  _Requires<_Callable<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_k0ff33[P]uWebSockets_src_Group_cpp:80:33)>,_function<void_(WebSocket<true>,_char_*,_unsigned_long)>_&>
  __x;
  long lVar1;
  NodeData *pNVar2;
  Group<true> *pGVar3;
  anon_class_1_0_00000001 local_5d;
  anon_class_1_0_00000001 local_5c;
  anon_class_1_0_00000001 local_5b;
  anon_class_1_0_00000001 local_5a;
  anon_class_1_0_00000001 local_59 [9];
  Hub *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  function<void(int)> *local_40;
  function<void(uWS::WebSocket<true>,char*,unsigned_long)> *local_38;
  
  local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT44(local_48._4_4_,extensionOptions);
  pNVar2 = nodeData;
  pGVar3 = this;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pGVar3->super_NodeData).recvBufferMemoryBlock = pNVar2->recvBufferMemoryBlock;
    pNVar2 = (NodeData *)&pNVar2->recvBuffer;
    pGVar3 = (Group<true> *)&(pGVar3->super_NodeData).recvBuffer;
  }
  local_50 = hub;
  std::vector<uS::NodeData::TransferData,_std::allocator<uS::NodeData::TransferData>_>::vector
            (&(this->super_NodeData).transferQueue,&nodeData->transferQueue);
  std::vector<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>::vector
            (&(this->super_NodeData).changePollQueue,&nodeData->changePollQueue);
  local_38 = (function<void(uWS::WebSocket<true>,char*,unsigned_long)> *)&this->pongHandler;
  local_40 = (function<void(int)> *)&this->errorHandler;
  memset(&this->connectionHandler,0,0xc0);
  this->hub = local_50;
  this->extensionOptions = (int)local_48;
  this->timer = (uv_timer_t *)0x0;
  local_48 = &(this->userPingMessage).field_2;
  (this->userPingMessage)._M_dataplus._M_p = (pointer)local_48;
  (this->userPingMessage)._M_string_length = 0;
  (this->userPingMessage).field_2._M_local_buf[0] = '\0';
  local_50 = (Hub *)&this->iterators;
  this->userData = (void *)0x0;
  this->webSocketHead = (uv_poll_t *)0x0;
  this->httpSocketHead = (uv_poll_t *)0x0;
  (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->iterators).c.super__Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>::_M_initialize_map
            ((_Deque_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_> *)local_50,0);
  std::function<void(uWS::WebSocket<true>,uWS::UpgradeInfo)>::operator=
            ((function<void(uWS::WebSocket<true>,uWS::UpgradeInfo)> *)&this->connectionHandler,
             local_59);
  std::function<void(uWS::WebSocket<true>,char*,unsigned_long,uWS::OpCode)>::operator=
            ((function<void(uWS::WebSocket<true>,char*,unsigned_long,uWS::OpCode)> *)
             &this->messageHandler,&local_5a);
  std::function<void(uWS::WebSocket<true>,int,char*,unsigned_long)>::operator=
            ((function<void(uWS::WebSocket<true>,int,char*,unsigned_long)> *)
             &this->disconnectionHandler,&local_5b);
  __x = std::function<void(uWS::WebSocket<true>,char*,unsigned_long)>::operator=(local_38,&local_5c)
  ;
  std::function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)>::operator=
            (&this->pingHandler,__x);
  std::function<void(int)>::operator=(local_40,&local_5d);
  *(byte *)&this->extensionOptions = (byte)this->extensionOptions | 6;
  return;
}

Assistant:

Group<isServer>::Group(int extensionOptions, Hub *hub, uS::NodeData *nodeData) : uS::NodeData(*nodeData), hub(hub), extensionOptions(extensionOptions) {
    connectionHandler = [](WebSocket<isServer>, UpgradeInfo) {};
    messageHandler = [](WebSocket<isServer>, char *, size_t, OpCode) {};
    disconnectionHandler = [](WebSocket<isServer>, int, char *, size_t) {};
    pingHandler = pongHandler = [](WebSocket<isServer>, char *, size_t) {};
    errorHandler = [](errorType) {};

    this->extensionOptions |= CLIENT_NO_CONTEXT_TAKEOVER | SERVER_NO_CONTEXT_TAKEOVER;
}